

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2607:23)>
::getImpl(SimpleTransformPromiseNode<kj::AsyncCapabilityStream::ReadResult,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:2607:23)>
          *this,ExceptionOrValue *output)

{
  ResultHolder *pRVar1;
  undefined8 uVar2;
  Fault local_3e0;
  Disposer *local_3d8;
  AsyncCapabilityStream *pAStack_3d0;
  size_t local_3c0;
  size_t local_3b8;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> local_388;
  ExceptionOr<kj::AsyncCapabilityStream::ReadResult> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  uVar2 = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr;
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    local_388.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.file;
    local_388.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1._32_8_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ = 0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar2;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         (char *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_388.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),0x105);
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr;
    local_388.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0
    ;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    depResult.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         (Detail *)0x0;
    local_388.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> *)
               output,&local_388);
    uVar2 = local_388.value.ptr.field_1.value.ptr.ptr;
    if ((local_388.value.ptr.isSet == true) &&
       (local_388.value.ptr.field_1.value.ptr.ptr != (AsyncCapabilityStream *)0x0)) {
      local_388.value.ptr.field_1.value.ptr.ptr = (AsyncCapabilityStream *)0x0;
      (**(local_388.value.ptr.field_1.value.ptr.disposer)->_vptr_Disposer)
                (local_388.value.ptr.field_1.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(((AsyncCapabilityStream *)uVar2)->super_AsyncIoStream).
                         super_AsyncInputStream._vptr_AsyncInputStream +
                 (long)(((AsyncCapabilityStream *)uVar2)->super_AsyncIoStream).
                       super_AsyncInputStream._vptr_AsyncInputStream[-2]));
    }
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_004239d9;
    pRVar1 = (this->func).result.ptr;
    local_3c0 = depResult.value.ptr.field_1.value.byteCount;
    local_3b8 = depResult.value.ptr.field_1.value.capCount;
    local_3d8 = (Disposer *)0x0;
    pAStack_3d0 = (AsyncCapabilityStream *)0x0;
    if (depResult.value.ptr.field_1.value.byteCount != 0) {
      _kjCondition.left = &local_3b8;
      _kjCondition.right = 1;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      _kjCondition.result = depResult.value.ptr.field_1.value.capCount == 1;
      if (_kjCondition.result) {
        local_3d8 = (pRVar1->stream).disposer;
        pAStack_3d0 = (pRVar1->stream).ptr;
        (pRVar1->stream).ptr = (AsyncCapabilityStream *)0x0;
      }
      else {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[83]>
                  (&local_3e0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                   ,0xa36,FAILED,"actual.capCount == 1",
                   "_kjCondition,\"expected to receive a capability (e.g. file descriptor via SCM_RIGHTS), but didn\'t\""
                   ,&_kjCondition,
                   (char (*) [83])
                   "expected to receive a capability (e.g. file descriptor via SCM_RIGHTS), but didn\'t"
                  );
        Debug::Fault::~Fault(&local_3e0);
      }
    }
    local_388.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_388.value.ptr.isSet = true;
    local_388.value.ptr.field_1.value.ptr.disposer = local_3d8;
    local_388.value.ptr.field_1.value.ptr.ptr = pAStack_3d0;
    ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::operator=
              ((ExceptionOr<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> *)
               output,&local_388);
    uVar2 = local_388.value.ptr.field_1.value.ptr.ptr;
    if ((local_388.value.ptr.isSet == true) &&
       (local_388.value.ptr.field_1.value.ptr.ptr != (AsyncCapabilityStream *)0x0)) {
      local_388.value.ptr.field_1.value.ptr.ptr = (AsyncCapabilityStream *)0x0;
      (**(local_388.value.ptr.field_1.value.ptr.disposer)->_vptr_Disposer)
                (local_388.value.ptr.field_1.value.ptr.disposer,
                 (_func_int *)
                 ((long)&(((AsyncCapabilityStream *)uVar2)->super_AsyncIoStream).
                         super_AsyncInputStream._vptr_AsyncInputStream +
                 (long)(((AsyncCapabilityStream *)uVar2)->super_AsyncIoStream).
                       super_AsyncInputStream._vptr_AsyncInputStream[-2]));
    }
  }
  if (local_388.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_388.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_004239d9:
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }